

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult *
iutest::internal::backward::NeHelper<false>::Compare<int>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,int *val1,int *val2)

{
  int *unaff_RBX;
  
  if (*val1 == *val2) {
    CmpHelperOpFailure<int,int>
              (__return_storage_ptr__,(internal *)expr1,expr2,"!=",(char *)val1,val2,unaff_RBX);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T& val1, const T& val2)
    {
        return CmpHelper<T, detail::has_not_equal_to<T>::value>::Compare(expr1, expr2, val1, val2);
    }